

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall TrodesConfig::TrodesConfig(TrodesConfig *this,TrodesConfig *obj)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  TrodesConfig *in_RSI;
  TrodesConfig *dst;
  NetworkDataType *in_RDI;
  TrodesConfig *objCpy;
  TrodesConfig *in_stack_ffffffffffffff78;
  TrodesConfig *in_stack_ffffffffffffff80;
  vector<NDevice,_std::allocator<NDevice>_> *this_00;
  vector<NDevice,_std::allocator<NDevice>_> *__x;
  
  dst = in_RSI;
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__TrodesConfig_005d6288;
  this_00 = (vector<NDevice,_std::allocator<NDevice>_> *)(in_RDI + 1);
  std::vector<NDevice,_std::allocator<NDevice>_>::vector
            ((vector<NDevice,_std::allocator<NDevice>_> *)0x352667);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)0x35267a);
  clear(in_stack_ffffffffffffff80);
  iVar1 = copy(in_RSI,(EVP_PKEY_CTX *)dst,src);
  __x = (vector<NDevice,_std::allocator<NDevice>_> *)CONCAT44(extraout_var,iVar1);
  getDevices(in_stack_ffffffffffffff78);
  std::vector<NDevice,_std::allocator<NDevice>_>::operator=(this_00,__x);
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(this_00);
  getNTrodes(in_stack_ffffffffffffff78);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::operator=
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)this_00,
             (vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)__x);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)this_00);
  return;
}

Assistant:

TrodesConfig::TrodesConfig(const TrodesConfig &obj) {
    clear();
//    std::cerr << "COPYING [" << &obj << "] into this [" << this << "]\n";

    TrodesConfig *objCpy = obj.copy(); //create a new memory copy of the target TrodesConfig object and assign it to self
    devices = objCpy->getDevices();
    nTrodes = objCpy->getNTrodes();
}